

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

EmptyMemberSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EmptyMemberSyntax,slang::syntax::EmptyMemberSyntax_const&>
          (BumpAllocator *this,EmptyMemberSyntax *args)

{
  EmptyMemberSyntax *pEVar1;
  EmptyMemberSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pEVar1 = (EmptyMemberSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::EmptyMemberSyntax::EmptyMemberSyntax(in_RSI,pEVar1);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }